

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O1

ExtractValueInst * LLVMBC::dyn_cast<LLVMBC::ExtractValueInst>(Value *value)

{
  ValueKind VVar1;
  ExtractValueInst *this;
  ExtractValueInst *pEVar2;
  
  if (value != (Value *)0x0) {
    this = (ExtractValueInst *)Internal::resolve_proxy(value);
    VVar1 = Value::get_value_kind((Value *)this);
    pEVar2 = (ExtractValueInst *)0x0;
    if (VVar1 == ExtractValue) {
      pEVar2 = this;
    }
    return pEVar2;
  }
  return (ExtractValueInst *)0x0;
}

Assistant:

inline const T *dyn_cast(const Value *value)
{
	if (!value)
		return nullptr;

	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
		return nullptr;
}